

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall (anonymous_namespace)::LineEdit::~LineEdit(LineEdit *this)

{
  anon_unknown.dwarf_2014f3::LineEdit::~LineEdit((LineEdit *)(this + -0x10));
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }